

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall iutest::detail::RegexMatcher::Regex(RegexMatcher *this,string *actual)

{
  char *__s;
  bool bVar1;
  
  __s = (actual->_M_dataplus)._M_p;
  if (this->m_full_match == true) {
    bVar1 = iuRegex::FullMatch(&this->m_expected,__s);
    return bVar1;
  }
  if (__s != (char *)0x0) {
    bVar1 = std::regex_search<char,std::__cxx11::regex_traits<char>>(__s,&(this->m_expected).m_re,0)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

bool Regex(const ::std::string& actual) const
    {
        return m_full_match ? m_expected.FullMatch(actual.c_str())
            : m_expected.PartialMatch(actual.c_str());
    }